

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mondata.c
# Opt level: O2

int max_passive_dmg(monst *mdef,monst *magr)

{
  uchar uVar1;
  permonst *ppVar2;
  byte bVar3;
  long lVar4;
  uint uVar5;
  
  ppVar2 = mdef->data;
  lVar4 = 0;
  while( true ) {
    if (lVar4 == 6) {
      return 0;
    }
    uVar1 = ppVar2->mattk[lVar4].aatyp;
    if ((uVar1 == '\x0e') || (uVar1 == '\0')) break;
    lVar4 = lVar4 + 1;
  }
  switch(ppVar2->mattk[lVar4].adtyp) {
  case '\0':
    goto switchD_001e1c14_caseD_0;
  default:
    return 0;
  case '\x02':
    bVar3 = (byte)magr->mintrinsics & 1;
    break;
  case '\x03':
    bVar3 = (byte)magr->mintrinsics & 2;
    break;
  case '\x06':
    bVar3 = (byte)magr->mintrinsics & 0x10;
    break;
  case '\b':
    bVar3 = (byte)magr->mintrinsics & 0x40;
  }
  if (bVar3 != 0) {
    return 0;
  }
switchD_001e1c14_caseD_0:
  bVar3 = ppVar2->mattk[lVar4].damn;
  uVar5 = (uint)bVar3;
  if (bVar3 == 0) {
    uVar5 = (int)ppVar2->mlevel + 1;
  }
  return ppVar2->mattk[lVar4].damd * uVar5;
}

Assistant:

int max_passive_dmg(struct monst *mdef, struct monst *magr)
{
    int	i, dmg = 0;
    uchar adtyp;

    for (i = 0; i < NATTK; i++)
	if (mdef->data->mattk[i].aatyp == AT_NONE ||
		mdef->data->mattk[i].aatyp == AT_BOOM) {
	    adtyp = mdef->data->mattk[i].adtyp;
	    if ((adtyp == AD_ACID && !resists_acid(magr)) ||
		    (adtyp == AD_COLD && !resists_cold(magr)) ||
		    (adtyp == AD_FIRE && !resists_fire(magr)) ||
		    (adtyp == AD_ELEC && !resists_elec(magr)) ||
		    adtyp == AD_PHYS) {
		dmg = mdef->data->mattk[i].damn;
		if (!dmg) dmg = mdef->data->mlevel+1;
		dmg *= mdef->data->mattk[i].damd;
	    } else dmg = 0;

	    return dmg;
	}
    return 0;
}